

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalable_decoder.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  int iVar3;
  FILE *pFVar4;
  aom_codec_iface_t *iface;
  char *pcVar5;
  size_t sVar6;
  aom_image_t *src;
  aom_image_t *dst;
  ulong uVar7;
  size_t bytes_in_buffer;
  uint8_t *buf;
  FILE *local_280;
  FILE *local_278;
  aom_codec_iter_t iter;
  size_t buffer_size;
  aom_codec_stream_info_t si;
  aom_codec_ctx_t codec;
  ObuDecInputContext local_210;
  FILE *outfile [5];
  uint8_t tmpbuf [32];
  char filename [80];
  AvxInputContext aom_input_ctx;
  
  buf = (uint8_t *)0x0;
  bytes_in_buffer = 0;
  buffer_size = 0;
  local_210.bytes_buffered = 0;
  local_210.is_annexb = 0;
  local_210._36_4_ = 0;
  local_210.buffer = (uint8_t *)0x0;
  local_210.buffer_capacity = 0;
  local_210.avx_ctx = &aom_input_ctx;
  exec_name = *argv;
  if (argc == 2) {
    pFVar4 = fopen64(argv[1],"rb");
    if (pFVar4 == (FILE *)0x0) {
      die("Failed to open %s for read.",argv[1]);
    }
    aom_input_ctx.filename = argv[1];
    aom_input_ctx.file = (FILE *)pFVar4;
    iface = get_aom_decoder_by_index(0);
    pcVar5 = aom_codec_iface_name(iface);
    printf("Using %s\n",pcVar5);
    aVar2 = aom_codec_dec_init_ver(&codec,iface,(aom_codec_dec_cfg_t *)0x0,0,0x16);
    if (aVar2 == AOM_CODEC_OK) {
      aVar2 = aom_codec_control(&codec,0x118,1);
      if (aVar2 == AOM_CODEC_OK) {
        uVar7 = 1;
        sVar6 = fread(tmpbuf,1,0x20,pFVar4);
        if (sVar6 == 0x20) {
          si.is_annexb = 0;
          aVar2 = aom_codec_peek_stream_info(iface,tmpbuf,0x20,&si);
          if (aVar2 == AOM_CODEC_OK) {
            fseek(pFVar4,-0x20,1);
            iVar3 = file_is_obu(&local_210);
            if (iVar3 != 0) {
              local_280 = pFVar4;
              snprintf(filename,0x50,"out_lyr%d.yuv",0);
              local_278 = fopen64(filename,"wb");
              outfile[0] = (FILE *)local_278;
              if (local_278 == (FILE *)0x0) {
                pcVar5 = "Failed top open output for writing.";
              }
              else {
                do {
                  if (si.number_spatial_layers <= uVar7) {
                    uVar7 = 0;
                    goto LAB_0011d9fc;
                  }
                  snprintf(filename,0x50,"out_lyr%u.yuv",uVar7 & 0xffffffff);
                  pFVar4 = fopen64(filename,"wb");
                  outfile[uVar7] = (FILE *)pFVar4;
                  uVar7 = uVar7 + 1;
                } while (pFVar4 != (FILE *)0x0);
                pcVar5 = "Failed to open output for writing.";
              }
              goto LAB_0011d9e5;
            }
          }
        }
        pcVar5 = "Input is not a valid obu file";
      }
      else {
        pcVar5 = "Failed to set output_all_layers control.";
      }
      goto LAB_0011db57;
    }
    pcVar5 = "Failed to initialize decoder.";
  }
  else {
    pcVar5 = "Invalid number of arguments.";
  }
LAB_0011d9e5:
  die(pcVar5);
LAB_0011d9fc:
  iVar3 = obudec_read_temporal_unit(&local_210,&buf,&bytes_in_buffer,&buffer_size);
  if (iVar3 != 0) goto LAB_0011daf0;
  iter = (aom_codec_iter_t)0x0;
  aVar2 = aom_codec_decode(&codec,buf,bytes_in_buffer,(void *)0x0);
  if (aVar2 != AOM_CODEC_OK) {
    pcVar5 = "Failed to decode frame.";
    goto LAB_0011db57;
  }
  while( true ) {
    src = aom_codec_get_frame(&codec,&iter);
    if (src == (aom_image_t *)0x0) break;
    dst = aom_img_alloc((aom_image_t *)0x0,AOM_IMG_FMT_I420,src->d_w,src->d_h,0x10);
    dst->bit_depth = 8;
    aom_img_downshift(dst,src,src->bit_depth - 8);
    uVar1 = src->spatial_id;
    if (uVar1 == 0) {
      printf("Writing        base layer 0 %d\n",uVar7);
      pFVar4 = local_278;
    }
    else {
      if ((int)(si.number_spatial_layers - 1) < (int)uVar1) {
        pcVar5 = "Invalid bitstream. Layer id exceeds layer count";
        goto LAB_0011db57;
      }
      printf("Writing enhancement layer %d %d\n",(ulong)uVar1,uVar7);
      pFVar4 = (FILE *)outfile[src->spatial_id];
    }
    aom_img_write(dst,(FILE *)pFVar4);
    uVar7 = (ulong)((int)uVar7 + (uint)(src->spatial_id == si.number_spatial_layers - 1));
  }
  goto LAB_0011d9fc;
LAB_0011daf0:
  printf("Processed %d frames.\n",uVar7);
  aVar2 = aom_codec_destroy(&codec);
  pFVar4 = local_280;
  if (aVar2 == AOM_CODEC_OK) {
    for (uVar7 = 0; uVar7 < si.number_spatial_layers; uVar7 = uVar7 + 1) {
      fclose((FILE *)outfile[uVar7]);
    }
    fclose(pFVar4);
    return 0;
  }
  pcVar5 = "Failed to destroy codec";
LAB_0011db57:
  die_codec(&codec,pcVar5);
}

Assistant:

int main(int argc, char **argv) {
  int frame_cnt = 0;
  FILE *outfile[MAX_LAYERS];
  char filename[80];
  FILE *inputfile = NULL;
  uint8_t *buf = NULL;
  size_t bytes_in_buffer = 0;
  size_t buffer_size = 0;
  struct AvxInputContext aom_input_ctx;
  struct ObuDecInputContext obu_ctx = { &aom_input_ctx, NULL, 0, 0, 0 };
  aom_codec_stream_info_t si;
  uint8_t tmpbuf[32];
  unsigned int i;

  exec_name = argv[0];

  if (argc != 2) die("Invalid number of arguments.");

  if (!(inputfile = fopen(argv[1], "rb")))
    die("Failed to open %s for read.", argv[1]);
  obu_ctx.avx_ctx->file = inputfile;
  obu_ctx.avx_ctx->filename = argv[1];

  aom_codec_iface_t *decoder = get_aom_decoder_by_index(0);
  printf("Using %s\n", aom_codec_iface_name(decoder));

  aom_codec_ctx_t codec;
  if (aom_codec_dec_init(&codec, decoder, NULL, 0))
    die("Failed to initialize decoder.");

  if (aom_codec_control(&codec, AV1D_SET_OUTPUT_ALL_LAYERS, 1)) {
    die_codec(&codec, "Failed to set output_all_layers control.");
  }

  // peak sequence header OBU to get number of spatial layers
  const size_t ret = fread(tmpbuf, 1, 32, inputfile);
  if (ret != 32) die_codec(&codec, "Input is not a valid obu file");
  si.is_annexb = 0;
  if (aom_codec_peek_stream_info(decoder, tmpbuf, 32, &si)) {
    die_codec(&codec, "Input is not a valid obu file");
  }
  fseek(inputfile, -32, SEEK_CUR);

  if (!file_is_obu(&obu_ctx))
    die_codec(&codec, "Input is not a valid obu file");

  // open base layer output yuv file
  snprintf(filename, sizeof(filename), "out_lyr%d.yuv", 0);
  if (!(outfile[0] = fopen(filename, "wb")))
    die("Failed top open output for writing.");

  // open any enhancement layer output yuv files
  for (i = 1; i < si.number_spatial_layers; i++) {
    snprintf(filename, sizeof(filename), "out_lyr%u.yuv", i);
    if (!(outfile[i] = fopen(filename, "wb")))
      die("Failed to open output for writing.");
  }

  while (!obudec_read_temporal_unit(&obu_ctx, &buf, &bytes_in_buffer,
                                    &buffer_size)) {
    aom_codec_iter_t iter = NULL;
    aom_image_t *img = NULL;
    if (aom_codec_decode(&codec, buf, bytes_in_buffer, NULL))
      die_codec(&codec, "Failed to decode frame.");

    while ((img = aom_codec_get_frame(&codec, &iter)) != NULL) {
      aom_image_t *img_shifted =
          aom_img_alloc(NULL, AOM_IMG_FMT_I420, img->d_w, img->d_h, 16);
      img_shifted->bit_depth = 8;
      aom_img_downshift(img_shifted, img,
                        img->bit_depth - img_shifted->bit_depth);
      if (img->spatial_id == 0) {
        printf("Writing        base layer 0 %d\n", frame_cnt);
        aom_img_write(img_shifted, outfile[0]);
      } else if (img->spatial_id <= (int)(si.number_spatial_layers - 1)) {
        printf("Writing enhancement layer %d %d\n", img->spatial_id, frame_cnt);
        aom_img_write(img_shifted, outfile[img->spatial_id]);
      } else {
        die_codec(&codec, "Invalid bitstream. Layer id exceeds layer count");
      }
      if (img->spatial_id == (int)(si.number_spatial_layers - 1)) ++frame_cnt;
    }
  }

  printf("Processed %d frames.\n", frame_cnt);
  if (aom_codec_destroy(&codec)) die_codec(&codec, "Failed to destroy codec");

  for (i = 0; i < si.number_spatial_layers; i++) fclose(outfile[i]);

  fclose(inputfile);

  return EXIT_SUCCESS;
}